

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O1

void __thiscall nv::ColorBlock::sortColorsByAbsoluteValue(ColorBlock *this)

{
  anon_union_4_2_12391d8d_for_Color32_0 aVar1;
  ulong uVar2;
  ulong uVar3;
  Color32 temp;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  anon_union_4_2_12391d8d_for_Color32_0 aVar8;
  ushort uVar9;
  
  uVar2 = 1;
  uVar3 = 0;
  do {
    aVar1 = (anon_union_4_2_12391d8d_for_Color32_0)this->m_color[uVar3].field_0.u;
    uVar4 = (uint)uVar3;
    if (uVar3 < 0xf) {
      uVar5 = uVar3 & 0xffffffff;
      uVar6 = uVar2;
      aVar8 = aVar1;
      do {
        uVar7 = (ushort)aVar8.u;
        uVar9 = (ushort)this->m_color[uVar6].field_0.u;
        if (uVar7 <= uVar9) {
          aVar8.u = this->m_color[uVar6].field_0.u;
        }
        if (uVar7 < uVar9) {
          uVar5 = uVar6 & 0xffffffff;
        }
        uVar4 = (uint)uVar5;
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x10);
    }
    this->m_color[uVar3].field_0 = this->m_color[uVar4].field_0;
    uVar3 = uVar3 + 1;
    this->m_color[uVar4].field_0.u = (uint32)aVar1;
    uVar2 = uVar2 + 1;
  } while (uVar3 != 0x10);
  return;
}

Assistant:

void ColorBlock::sortColorsByAbsoluteValue()
{
	// Dummy selection sort.
	for( uint a = 0; a < 16; a++ ) {
		uint max = a;
		Color16 cmax(m_color[a]);
		
		for( uint b = a+1; b < 16; b++ ) {
			Color16 cb(m_color[b]);
			
			if( cb.u > cmax.u ) {
				max = b;
				cmax = cb;
			}
		}
		swap( m_color[a], m_color[max] );
	}
}